

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t c4::to_chars(void *param_1,ulong param_2)

{
  void *__dest;
  ulong uVar1;
  void *in_stack_00000008;
  ulong in_stack_00000010;
  long in_stack_00000018;
  
  if (in_stack_00000010 <= param_2) {
    __dest = (void *)(-in_stack_00000018 & (long)param_1 + in_stack_00000018 + -1);
    if (((ulong)((long)__dest - (long)param_1) <= param_2 - in_stack_00000010) &&
       (__dest != (void *)0x0)) {
      if ((__dest < param_1) || ((void *)((long)param_1 + param_2) < __dest)) {
        to_chars();
      }
      uVar1 = ((long)__dest - (long)param_1) + in_stack_00000010;
      if (param_2 < uVar1) {
        return uVar1;
      }
      memcpy(__dest,in_stack_00000008,in_stack_00000010);
      return uVar1;
    }
  }
  return in_stack_00000010 + in_stack_00000018;
}

Assistant:

size_t to_chars(substr buf, fmt::const_raw_wrapper r)
{
    void * vptr = buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r.alignment, r.len, vptr, space);
    if(ptr == nullptr)
    {
        // if it was not possible to align, return a conservative estimate
        // of the required space
        return r.alignment + r.len;
    }
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    size_t sz = static_cast<size_t>(ptr - buf.str) + r.len;
    if(sz <= buf.len)
    {
        memcpy(ptr, r.buf, r.len);
    }
    return sz;
}